

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_getfenv(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  jit_State *in_RSI;
  jit_State *in_RDI;
  TRef trl;
  TRef tr;
  undefined4 in_stack_ffffffffffffffc8;
  
  uVar1 = *in_RDI->base;
  if ((((uVar1 & 0x1f000000) == 0x13000000) && ((uVar1 & 0xffff) < 0x8000)) &&
     ((in_RDI->cur).ir[uVar1 & 0xffff].field_1.op12 == 0)) {
    (in_RDI->fold).ins.field_0.ot = 0x4006;
    (in_RDI->fold).ins.field_0.op1 = 0;
    (in_RDI->fold).ins.field_0.op2 = 0;
    TVar2 = lj_opt_fold(in_RDI);
    (in_RDI->fold).ins.field_0.ot = 0x440b;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (in_RDI->fold).ins.field_0.op2 = 4;
    TVar2 = lj_opt_fold(in_RDI);
    *in_RDI->base = TVar2;
  }
  else {
    recff_nyi(in_RSI,(RecordFFData *)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_getfenv(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  /* Only support getfenv(0) for now. */
  if (tref_isint(tr) && tref_isk(tr) && IR(tref_ref(tr))->i == 0) {
    TRef trl = emitir(IRT(IR_LREF, IRT_THREAD), 0, 0);
    J->base[0] = emitir(IRT(IR_FLOAD, IRT_TAB), trl, IRFL_THREAD_ENV);
    return;
  }
  recff_nyiu(J, rd);
}